

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O1

int32 bio_fread_2d(void ***arr,size_t e_sz,uint32 *d1,uint32 *d2,FILE *fp,uint32 swap,uint32 *chksum
                  )

{
  int32 iVar1;
  uint32 uVar2;
  void **ppvVar3;
  char *fmt;
  long ln;
  uint32 l_d2;
  uint32 l_d1;
  void *raw;
  uint32 local_4c;
  uint local_48;
  uint local_44;
  size_t local_40;
  void *local_38;
  
  iVar1 = bio_fread(&local_44,4,1,fp,swap,chksum);
  if (iVar1 == 1) {
    local_40 = e_sz;
    iVar1 = bio_fread(&local_48,4,1,fp,swap,chksum);
    if (iVar1 == 1) {
      uVar2 = bio_fread_1d(&local_38,local_40,&local_4c,fp,swap,chksum);
      if (uVar2 != local_4c) {
        return -1;
      }
      if (local_4c == local_48 * local_44) {
        *d1 = local_44;
        *d2 = local_48;
        ppvVar3 = (void **)__ckd_alloc_2d_ptr((ulong)local_44,(ulong)local_48,local_38,local_40,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                                              ,0x1a9);
        *arr = ppvVar3;
        return local_4c;
      }
      __assert_fail("n == l_d1*l_d2",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                    ,0x1a5,
                    "int32 bio_fread_2d(void ***, size_t, uint32 *, uint32 *, FILE *, uint32, uint32 *)"
                   );
    }
    if (iVar1 == 0) {
      fmt = "Unable to read complete data";
      ln = 0x19b;
    }
    else {
      fmt = "OS error in bio_fread_2d";
      ln = 0x19e;
    }
  }
  else if (iVar1 == 0) {
    fmt = "Unable to read complete data";
    ln = 0x191;
  }
  else {
    fmt = "OS error in bio_fread_2d";
    ln = 0x194;
  }
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                 ,ln,fmt);
  return -1;
}

Assistant:

int32
bio_fread_2d(void ***arr,
             size_t e_sz,
             uint32 *d1,
             uint32 *d2,
             FILE *fp,
             uint32 swap,
             uint32 *chksum)
{
    uint32 l_d1, l_d2;
    uint32 n;
    size_t ret;
    void *raw;
    
    ret = bio_fread(&l_d1, sizeof(uint32), 1, fp, swap, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to read complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fread_2d");
	}
	return -1;
    }
    ret = bio_fread(&l_d2, sizeof(uint32), 1, fp, swap, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to read complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fread_2d");
	}
	return -1;
    }
    if (bio_fread_1d(&raw, e_sz, &n, fp, swap, chksum) != (int32)n)
	return -1;

    assert(n == l_d1*l_d2);

    *d1 = l_d1;
    *d2 = l_d2;
    *arr = ckd_alloc_2d_ptr(l_d1, l_d2, raw, e_sz);

    return n;
}